

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_int16 *
drwav_open_memory_and_read_pcm_frames_s16
          (void *data,size_t dataSize,uint *channelsOut,uint *sampleRateOut,
          drwav_uint64 *totalFrameCountOut)

{
  undefined4 *in_RCX;
  uint *in_RDX;
  ulong *in_R8;
  drwav_int16 *result;
  drwav_uint64 totalSampleCount;
  uint sampleRate;
  uint channels;
  drwav_uint64 *in_stack_00000158;
  uint *in_stack_00000160;
  uint *in_stack_00000168;
  size_t in_stack_00000170;
  void *in_stack_00000178;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_8;
  
  if (in_RDX != (uint *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (ulong *)0x0) {
    *in_R8 = 0;
  }
  local_8 = drwav_open_memory_and_read_s16
                      (in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160,
                       in_stack_00000158);
  if (local_8 == (drwav_int16 *)0x0) {
    local_8 = (drwav_int16 *)0x0;
  }
  else {
    if (in_RDX != (uint *)0x0) {
      *in_RDX = local_34;
    }
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = local_38;
    }
    if (in_R8 != (ulong *)0x0) {
      *in_R8 = local_40 / local_34;
    }
  }
  return local_8;
}

Assistant:

drwav_int16* drwav_open_memory_and_read_pcm_frames_s16(const void* data, size_t dataSize, unsigned int* channelsOut, unsigned int* sampleRateOut, drwav_uint64* totalFrameCountOut)
{
    if (channelsOut) *channelsOut = 0;
    if (sampleRateOut) *sampleRateOut = 0;
    if (totalFrameCountOut) *totalFrameCountOut = 0;

    unsigned int channels;
    unsigned int sampleRate;
    drwav_uint64 totalSampleCount;
    drwav_int16* result = drwav_open_memory_and_read_s16(data, dataSize, &channels, &sampleRate, &totalSampleCount);
    if (result == NULL) {
        return NULL;
    }

    if (channelsOut) *channelsOut = channels;
    if (sampleRateOut) *sampleRateOut = sampleRate;
    if (totalFrameCountOut) *totalFrameCountOut = totalSampleCount / channels;

    return result;
}